

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_1::BaseLineCase::iterate(BaseLineCase *this)

{
  float fVar1;
  float afVar2 [2];
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  RenderTarget *pRVar5;
  char *description;
  IterateResult IVar6;
  qpTestResult testResult;
  ulong uVar7;
  char *pcVar8;
  string local_d8;
  float range [2];
  ScopedLogSection section;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Surface resultImage;
  RasterizationArguments local_48;
  string iterationDescription;
  
  local_48.numSamples = this->m_iteration + 1;
  de::toString<int>((string *)&drawBuffer,&local_48.numSamples);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultImage,
                 "Test iteration ",(string *)&drawBuffer);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)range,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultImage,
                 " / ");
  de::toString<int>(&local_d8,&this->m_iterationCount);
  std::operator+(&iterationDescription,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)range,
                 &local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)range);
  std::__cxx11::string::~string((string *)&resultImage);
  std::__cxx11::string::~string((string *)&drawBuffer);
  tcu::ScopedLogSection::ScopedLogSection
            (&section,((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx)->m_log,&iterationDescription,&iterationDescription);
  iVar4 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&resultImage,iVar4,iVar4);
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.field_2._M_allocated_capacity = 0;
  local_d8._M_dataplus._M_p = (pointer)0x0;
  local_d8._M_string_length = 0;
  uVar7 = (ulong)(uint)this->m_iteration;
  if ((this->m_primitiveWideness == PRIMITIVEWIDENESS_WIDE) &&
     (this->m_iteration + 1U == this->m_iterationCount)) {
    range[0] = 0.0;
    range[1] = 0.0;
    iVar4 = (*((this->super_BaseRenderingCase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar4) + 0x818))(0x846e,range);
    (this->super_BaseRenderingCase).m_lineWidth = range[1];
    uVar7 = (ulong)(uint)this->m_iteration;
  }
  (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,uVar7,&drawBuffer,&local_d8);
  BaseRenderingCase::drawPrimitives
            (&this->super_BaseRenderingCase,&resultImage,&drawBuffer,this->m_primitiveDrawType);
  range[0] = 0.0;
  range[1] = 0.0;
  local_48.numSamples = (this->super_BaseRenderingCase).m_numSamples;
  local_48.subpixelBits = (this->super_BaseRenderingCase).m_subpixelBits;
  pRVar5 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  local_48.redBits = (pRVar5->m_pixelFormat).redBits;
  pRVar5 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  local_48.greenBits = (pRVar5->m_pixelFormat).greenBits;
  pRVar5 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  afVar2 = range;
  local_48.blueBits = (pRVar5->m_pixelFormat).blueBits;
  range = (float  [2])local_d8._M_dataplus._M_p;
  local_d8._M_dataplus._M_p = (pointer)afVar2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  fVar1 = (this->super_BaseRenderingCase).m_lineWidth;
  bVar3 = tcu::verifyLineGroupRasterization
                    (&resultImage,(LineSceneSpec *)range,&local_48,
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_log);
  if (((this->super_BaseRenderingCase).m_numSamples < 2 || bVar3) || fVar1 == 1.0) {
    if (!bVar3) {
      this->m_allIterationsPassed = false;
    }
  }
  else {
    this->m_multisampleRelaxationRequired = true;
  }
  std::_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
  ~_Vector_base((_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 *)range);
  iVar4 = this->m_iteration + 1;
  this->m_iteration = iVar4;
  if (iVar4 == this->m_iterationCount) {
    pcVar8 = "Pass";
    if ((this->m_multisampleRelaxationRequired & 1U) != 0) {
      pcVar8 = "Rasterization of multisampled wide lines failed";
    }
    bVar3 = this->m_allIterationsPassed != false;
    testResult = QP_TEST_RESULT_FAIL;
    if (bVar3) {
      testResult = (this->m_multisampleRelaxationRequired & 1) * 3;
    }
    description = "Incorrect rasterization";
    if (bVar3) {
      description = pcVar8;
    }
    IVar6 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,testResult,description);
  }
  else {
    IVar6 = CONTINUE;
  }
  std::_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
  ~_Vector_base((_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 *)&local_d8);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  tcu::Surface::~Surface(&resultImage);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::~string((string *)&iterationDescription);
  return IVar6;
}

Assistant:

BaseLineCase::IterateResult BaseLineCase::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_testCtx.getLog(), iterationDescription, iterationDescription);
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<LineSceneSpec::SceneLine>	lines;

	// last iteration, max out size
	if (m_primitiveWideness == PRIMITIVEWIDENESS_WIDE &&
		m_iteration+1 == m_iterationCount)
	{
		float range[2] = { 0.0f, 0.0f };
		m_context.getRenderContext().getFunctions().getFloatv(GL_ALIASED_LINE_WIDTH_RANGE, range);

		m_lineWidth = range[1];
	}

	// gen data
	generateLines(m_iteration, drawBuffer, lines);

	// draw image
	drawPrimitives(resultImage, drawBuffer, m_primitiveDrawType);

	// compare
	{
		bool					compareOk;
		RasterizationArguments	args;
		LineSceneSpec			scene;

		args.numSamples		= m_numSamples;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= m_context.getRenderTarget().getPixelFormat().redBits;
		args.greenBits		= m_context.getRenderTarget().getPixelFormat().greenBits;
		args.blueBits		= m_context.getRenderTarget().getPixelFormat().blueBits;

		scene.lines.swap(lines);
		scene.lineWidth = m_lineWidth;

		compareOk = verifyLineGroupRasterization(resultImage, scene, args, m_testCtx.getLog());

		// multisampled wide lines might not be supported
		if (scene.lineWidth != 1.0f && m_numSamples > 1 && !compareOk)
		{
			m_multisampleRelaxationRequired = true;
			compareOk = true;
		}

		if (!compareOk)
			m_allIterationsPassed = false;
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed && m_multisampleRelaxationRequired)
			m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Rasterization of multisampled wide lines failed");
		else if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect rasterization");

		return STOP;
	}
	else
		return CONTINUE;
}